

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer puVar1;
  Pattern *pPVar2;
  int iVar3;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  pointer puVar4;
  bool bVar5;
  
  bVar5 = (testCase->properties & IsHidden) == None;
  puVar4 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      pPVar2 = puVar4->m_ptr;
      if (pPVar2 == (Pattern *)0x0) goto LAB_001277b8;
      iVar3 = (*pPVar2->_vptr_Pattern[2])(pPVar2,testCase);
      if ((char)iVar3 == '\0') {
        return false;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
    bVar5 = true;
  }
  puVar4 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar4 == puVar1) {
      return bVar5;
    }
    pPVar2 = puVar4->m_ptr;
    if (pPVar2 == (Pattern *)0x0) break;
    iVar3 = (*pPVar2->_vptr_Pattern[2])(pPVar2,testCase);
    if ((char)iVar3 != '\0') {
      return false;
    }
    puVar4 = puVar4 + 1;
  }
LAB_001277b8:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                ,0x389,
                "const T *Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->() const [T = Catch::TestSpec::Pattern]"
               );
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        bool should_use = !testCase.isHidden();
        for (auto const& pattern : m_required) {
            should_use = true;
            if (!pattern->matches(testCase)) {
                return false;
            }
        }
        for (auto const& pattern : m_forbidden) {
            if (pattern->matches(testCase)) {
                return false;
            }
        }
        return should_use;
    }